

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceHashKey::ShaderResourceHashKey<char_const*const&>
          (ShaderResourceHashKey *this,SHADER_TYPE _ShaderStages,char **Args)

{
  size_t sVar1;
  SHADER_TYPE local_2c;
  size_t local_28;
  char **local_20;
  char **Args_local;
  ShaderResourceHashKey *pSStack_10;
  SHADER_TYPE _ShaderStages_local;
  ShaderResourceHashKey *this_local;
  
  local_20 = Args;
  Args_local._4_4_ = _ShaderStages;
  pSStack_10 = this;
  HashMapStringKey::HashMapStringKey(&this->super_HashMapStringKey,*Args,false);
  this->ShaderStages = Args_local._4_4_;
  local_28 = HashMapStringKey::GetHash(&this->super_HashMapStringKey);
  local_2c = this->ShaderStages;
  sVar1 = ComputeHash<unsigned_long,unsigned_int>(&local_28,&local_2c);
  (this->super_HashMapStringKey).Ownership_Hash = sVar1 & 0x7fffffffffffffff;
  return;
}

Assistant:

ShaderResourceHashKey(const SHADER_TYPE _ShaderStages,
                          ArgsType&&... Args) noexcept :
        // clang-format off
        HashMapStringKey{std::forward<ArgsType>(Args)...},
        ShaderStages    {_ShaderStages}
    // clang-format on
    {
        Ownership_Hash = ComputeHash(GetHash(), Uint32{ShaderStages}) & HashMask;
    }